

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::emplace<Parser::IncludePath>
          (QGenericArrayOps<Parser::IncludePath> *this,qsizetype i,IncludePath *args)

{
  qsizetype *pqVar1;
  IncludePath **ppIVar2;
  bool bVar3;
  Data *pDVar4;
  IncludePath *pIVar5;
  QArrayData *pQVar6;
  char *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Inserter local_a8;
  IncludePath local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<Parser::IncludePath>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011e6b0:
    pQVar6 = &((args->path).d.d)->super_QArrayData;
    (args->path).d.d = (Data *)0x0;
    pcVar7 = (args->path).d.ptr;
    (args->path).d.ptr = (char *)0x0;
    qVar8 = (args->path).d.size;
    (args->path).d.size = 0;
    bVar3 = args->isFrameworkPath;
    local_58._25_7_ = 0xaaaaaaaaaaaaaa;
    local_58.isFrameworkPath = bVar3;
    bVar10 = (this->super_QArrayDataPointer<Parser::IncludePath>).size != 0;
    local_58.path.d.d = (Data *)pQVar6;
    local_58.path.d.ptr = pcVar7;
    local_58.path.d.size = qVar8;
    QArrayDataPointer<Parser::IncludePath>::detachAndGrow
              (&this->super_QArrayDataPointer<Parser::IncludePath>,(uint)(i == 0 && bVar10),1,
               (IncludePath **)0x0,(QArrayDataPointer<Parser::IncludePath> *)0x0);
    if (i != 0 || !bVar10) {
      local_a8.sourceCopyConstruct = 0;
      local_a8.nSource = 0;
      local_a8.move = 0;
      local_a8.sourceCopyAssign = 0;
      local_a8.end = (IncludePath *)0x0;
      local_a8.last = (IncludePath *)0x0;
      local_a8.where = (IncludePath *)0x0;
      local_a8.begin = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
      local_a8.size = (this->super_QArrayDataPointer<Parser::IncludePath>).size;
      local_a8.data = &this->super_QArrayDataPointer<Parser::IncludePath>;
      Inserter::insertOne(&local_a8,i,&local_58);
      (local_a8.data)->ptr = local_a8.begin;
      (local_a8.data)->size = local_a8.size;
      if (&(local_58.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_58.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_58.path.d.d)->super_QArrayData,1,0x10);
        }
      }
      goto LAB_0011e7bd;
    }
    pIVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
    pIVar5[-1].path.d.d = (Data *)pQVar6;
    pIVar5[-1].path.d.ptr = pcVar7;
    pIVar5[-1].path.d.size = qVar8;
    pIVar5[-1].isFrameworkPath = bVar3;
    (this->super_QArrayDataPointer<Parser::IncludePath>).ptr = pIVar5 + -1;
  }
  else if (((this->super_QArrayDataPointer<Parser::IncludePath>).size == i) &&
          (pIVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr,
          (pDVar4->super_QArrayData).alloc !=
          ((long)((long)pIVar5 -
                 ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5)
          + i)) {
    pDVar9 = (args->path).d.d;
    (args->path).d.d = (Data *)0x0;
    pIVar5[i].path.d.d = pDVar9;
    pcVar7 = (args->path).d.ptr;
    (args->path).d.ptr = (char *)0x0;
    pIVar5[i].path.d.ptr = pcVar7;
    qVar8 = (args->path).d.size;
    (args->path).d.size = 0;
    pIVar5[i].path.d.size = qVar8;
    pIVar5[i].isFrameworkPath = args->isFrameworkPath;
  }
  else {
    if ((i != 0) ||
       (pIVar5 = (this->super_QArrayDataPointer<Parser::IncludePath>).ptr,
       (IncludePath *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
       == pIVar5)) goto LAB_0011e6b0;
    pDVar9 = (args->path).d.d;
    (args->path).d.d = (Data *)0x0;
    pIVar5[-1].path.d.d = pDVar9;
    pcVar7 = (args->path).d.ptr;
    (args->path).d.ptr = (char *)0x0;
    pIVar5[-1].path.d.ptr = pcVar7;
    qVar8 = (args->path).d.size;
    (args->path).d.size = 0;
    pIVar5[-1].path.d.size = qVar8;
    pIVar5[-1].isFrameworkPath = args->isFrameworkPath;
    ppIVar2 = &(this->super_QArrayDataPointer<Parser::IncludePath>).ptr;
    *ppIVar2 = *ppIVar2 + -1;
  }
  pqVar1 = &(this->super_QArrayDataPointer<Parser::IncludePath>).size;
  *pqVar1 = *pqVar1 + 1;
LAB_0011e7bd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }